

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O2

int BZ2_bzwrite(BZFILE *b,void *buf,int len)

{
  undefined8 in_RAX;
  int bzerr;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  BZ2_bzWrite(&local_14,b,buf,len);
  return -(uint)(local_14 != 0) | len;
}

Assistant:

int BZ2_bzwrite (BZFILE* b, void* buf, int len )
{
   int bzerr;

   BZ2_bzWrite(&bzerr,b,buf,len);
   if(bzerr == BZ_OK){
      return len;
   }else{
      return -1;
   }
}